

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdICHull.cpp
# Opt level: O2

bool __thiscall
HACD::ICHUll::ComputePointVolume(ICHUll *this,double *totalVolume,bool markVisibleFaces)

{
  CircularListElement<HACD::TMMTriangle> *pCVar1;
  CircularListElement<HACD::TMMVertex> *pCVar2;
  pointer ppCVar3;
  ICHUll *pIVar4;
  size_t sVar5;
  size_t sVar6;
  byte bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  CircularListElement<HACD::TMMTriangle> *f;
  Vec3<double> ver2;
  Vec3<double> ver1;
  Vec3<double> ver0;
  CircularListElement<HACD::TMMTriangle> *local_c0;
  ICHUll *local_b8;
  vector<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
  *local_b0;
  Vec3<double> local_a8;
  Vec3<double> local_88;
  Vec3<double> local_68;
  Vec3<double> local_48;
  undefined1 extraout_var [56];
  
  pCVar1 = (this->m_mesh).m_triangles.m_head;
  bVar7 = 0;
  pCVar2 = (this->m_mesh).m_vertices.m_head;
  local_48.m_data[2] = (pCVar2->m_data).m_pos.m_data[2];
  local_48.m_data[0] = (pCVar2->m_data).m_pos.m_data[0];
  local_48.m_data[1] = (pCVar2->m_data).m_pos.m_data[1];
  *totalVolume = 0.0;
  local_b0 = &this->m_trianglesToDelete;
  local_c0 = pCVar1;
  local_b8 = this;
  do {
    pCVar2 = (local_c0->m_data).m_vertices[0];
    local_68.m_data[0] = (pCVar2->m_data).m_pos.m_data[0];
    local_68.m_data[1] = (pCVar2->m_data).m_pos.m_data[1];
    local_68.m_data[2] = (pCVar2->m_data).m_pos.m_data[2];
    pCVar2 = (local_c0->m_data).m_vertices[1];
    local_88.m_data[0] = (pCVar2->m_data).m_pos.m_data[0];
    local_88.m_data[1] = (pCVar2->m_data).m_pos.m_data[1];
    local_88.m_data[2] = (pCVar2->m_data).m_pos.m_data[2];
    pCVar2 = (local_c0->m_data).m_vertices[2];
    local_a8.m_data[0] = (pCVar2->m_data).m_pos.m_data[0];
    local_a8.m_data[1] = (pCVar2->m_data).m_pos.m_data[1];
    local_a8.m_data[2] = (pCVar2->m_data).m_pos.m_data[2];
    auVar9._0_8_ = Volume<double>(&local_68,&local_88,&local_a8,&local_48);
    auVar9._8_56_ = extraout_var;
    if (auVar9._0_8_ < -1e-09) {
      auVar8._8_8_ = 0x7fffffffffffffff;
      auVar8._0_8_ = 0x7fffffffffffffff;
      auVar8 = vandpd_avx512vl(auVar9._0_16_,auVar8);
      *totalVolume = auVar8._0_8_ + *totalVolume;
      if (markVisibleFaces) {
        bVar7 = 1;
        (local_c0->m_data).m_visible = true;
        std::
        vector<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
        ::push_back(local_b0,&local_c0);
      }
      else {
        bVar7 = 1;
      }
    }
    pIVar4 = local_b8;
    local_c0 = local_c0->m_next;
  } while (local_c0 != pCVar1);
  ppCVar3 = (local_b8->m_trianglesToDelete).
            super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  sVar5 = (long)(local_b8->m_trianglesToDelete).
                super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3;
  if (sVar5 == (local_b8->m_mesh).m_triangles.m_size) {
    for (sVar6 = 0; sVar5 != sVar6; sVar6 = sVar6 + 1) {
      (ppCVar3[sVar6]->m_data).m_visible = false;
    }
    bVar7 = 0;
  }
  if (markVisibleFaces && bVar7 == 0) {
    CircularList<HACD::TMMVertex>::Delete(&(local_b8->m_mesh).m_vertices);
    ppCVar3 = (pIVar4->m_trianglesToDelete).
              super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((pIVar4->m_trianglesToDelete).
        super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppCVar3) {
      (pIVar4->m_trianglesToDelete).
      super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppCVar3;
    }
  }
  return (bool)(!markVisibleFaces | bVar7);
}

Assistant:

bool ICHUll::ComputePointVolume(double &totalVolume, bool markVisibleFaces)
    {
        // mark visible faces
        CircularListElement<TMMTriangle> * fHead = m_mesh.GetTriangles().GetHead();
        CircularListElement<TMMTriangle> * f = fHead;
        CircularList<TMMVertex> & vertices = m_mesh.GetVertices();
        CircularListElement<TMMVertex> * vertex0 = vertices.GetHead();
        bool visible = false;
        Vec3<double> pos0 = Vec3<double>(vertex0->GetData().m_pos.X(),
										 vertex0->GetData().m_pos.Y(),
										 vertex0->GetData().m_pos.Z());
        double vol = 0.0;
        totalVolume = 0.0;
		Vec3<double> ver0, ver1, ver2;		
        do 
        {
			ver0.X() = f->GetData().m_vertices[0]->GetData().m_pos.X();
			ver0.Y() = f->GetData().m_vertices[0]->GetData().m_pos.Y();
			ver0.Z() = f->GetData().m_vertices[0]->GetData().m_pos.Z();
			ver1.X() = f->GetData().m_vertices[1]->GetData().m_pos.X();
			ver1.Y() = f->GetData().m_vertices[1]->GetData().m_pos.Y();
			ver1.Z() = f->GetData().m_vertices[1]->GetData().m_pos.Z();
			ver2.X() = f->GetData().m_vertices[2]->GetData().m_pos.X();
			ver2.Y() = f->GetData().m_vertices[2]->GetData().m_pos.Y();
			ver2.Z() = f->GetData().m_vertices[2]->GetData().m_pos.Z();
			vol = Volume(ver0, ver1, ver2, pos0);
			if ( vol < -sc_eps)
			{
				vol = fabs(vol);
				totalVolume += vol;
				if (markVisibleFaces)
				{
					f->GetData().m_visible = true;
					m_trianglesToDelete.push_back(f);
				}
				visible = true;
			}
			f = f->GetNext();
        } 
        while (f != fHead);

		if (m_trianglesToDelete.size() == m_mesh.m_triangles.GetSize())
		{
			for(size_t i = 0; i < m_trianglesToDelete.size(); i++)
			{
				m_trianglesToDelete[i]->GetData().m_visible = false;
			}
			visible = false;
		}
        // if no faces visible from p then p is inside the hull
        if (!visible && markVisibleFaces)
        {
            vertices.Delete();
			m_trianglesToDelete.clear();
            return false;
        }
        return true;
    }